

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *
getSlicingCriteriaInstructions
          (vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *__return_storage_ptr__,
          Module *M,string *slicingCriteria,bool criteria_are_next_instr,LLVMPointerAnalysis *pta,
          bool constructed_only)

{
  _Rb_tree_header *p_Var1;
  Value *pVVar2;
  pointer pSVar3;
  pointer pbVar4;
  pointer pbVar5;
  raw_ostream *prVar6;
  _Rb_tree_node_base *p_Var7;
  Instruction *pIVar8;
  _Base_ptr p_Var9;
  SlicingCriteriaSet *SC;
  pointer opt;
  pointer pSVar10;
  ulong uVar11;
  vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_> *__range2;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  primsec;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *__range3;
  Instruction *local_b0;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  newset;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  secondaryToAll;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  criteria;
  
  splitList(&criteria,slicingCriteria,';');
  (__return_storage_ptr__->
  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header;
  secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  opt = criteria.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (opt == criteria.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      if (secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pSVar3 = (__return_storage_ptr__->
                 super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar10 = (__return_storage_ptr__->
                       super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>).
                       _M_impl.super__Vector_impl_data._M_start; pSVar10 != pSVar3;
            pSVar10 = pSVar10 + 1) {
          if ((pSVar10->primary)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            std::
            _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                      ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                        *)&pSVar10->secondary,
                       (_Rb_tree_const_iterator<const_llvm::Value_*>)
                       secondaryToAll._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<const_llvm::Value_*>)
                       &secondaryToAll._M_t._M_impl.super__Rb_tree_header);
          }
        }
      }
      std::
      _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
      ::~_Rb_tree(&secondaryToAll._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&criteria);
      return __return_storage_ptr__;
    }
    if (opt->_M_string_length != 0) {
      std::vector<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>::emplace_back<>
                (__return_storage_ptr__);
      splitList(&primsec,opt,'|');
      if (0x40 < (ulong)((long)primsec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)primsec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        prVar6 = (raw_ostream *)llvm::errs();
        llvm::raw_ostream::operator<<
                  (prVar6,"WARNING: Only one | in SC supported, ignoring the rest\n");
      }
      pbVar5 = primsec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = primsec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar10 = (__return_storage_ptr__->
                super__Vector_base<SlicingCriteriaSet,_std::allocator<SlicingCriteriaSet>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      bVar12 = (primsec.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0;
      if (!bVar12) {
        getCriteriaInstructions
                  (M,pta,primsec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,&pSVar10[-1].primary,
                   constructed_only);
      }
      bVar12 = bVar12 && 0x20 < (ulong)((long)pbVar5 - (long)pbVar4);
      if (pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        prVar6 = (raw_ostream *)llvm::errs();
        prVar6 = llvm::raw_ostream::operator<<(prVar6,"SC: Matched \'");
        prVar6 = llvm::raw_ostream::operator<<
                           (prVar6,primsec.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        llvm::raw_ostream::operator<<(prVar6,"\' to: \n");
        p_Var1 = &pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header;
        uVar11 = 0;
        for (p_Var7 = pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != p_Var1;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          if (uVar11 == 10) {
            uVar11 = 0xb;
            break;
          }
          uVar11 = uVar11 + 1;
          pVVar2 = *(Value **)(p_Var7 + 1);
          prVar6 = (raw_ostream *)llvm::errs();
          prVar6 = llvm::raw_ostream::operator<<(prVar6,"  ");
          prVar6 = llvm::operator<<(prVar6,pVVar2);
          llvm::raw_ostream::operator<<(prVar6,"\n");
        }
        if (uVar11 <= pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          prVar6 = (raw_ostream *)llvm::errs();
          prVar6 = llvm::raw_ostream::operator<<(prVar6," ... and  ");
          prVar6 = (raw_ostream *)
                   llvm::raw_ostream::operator<<
                             (prVar6,(pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count - uVar11) + 1);
          llvm::raw_ostream::operator<<(prVar6," more\n");
        }
        if (criteria_are_next_instr) {
          newset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          newset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          newset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &newset._M_t._M_impl.super__Rb_tree_header._M_header;
          newset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          newset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               newset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (p_Var7 = pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != p_Var1;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            pVVar2 = *(Value **)(p_Var7 + 1);
            if (((pVVar2 == (Value *)0x0) || ((byte)pVVar2[0x10] < 0x1b)) ||
               (pIVar8 = llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::
                         getNextNode((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)
                                     (pVVar2 + 0x18)), pIVar8 == (Instruction *)0x0)) {
              prVar6 = (raw_ostream *)llvm::errs();
              prVar6 = llvm::raw_ostream::operator<<
                                 (prVar6,"WARNING: unable to get next instr for ");
              prVar6 = llvm::operator<<(prVar6,pVVar2);
              llvm::raw_ostream::operator<<(prVar6,"\n");
            }
            else {
              local_b0 = pIVar8;
              std::
              _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
              ::_M_insert_unique<llvm::Value_const*>
                        ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                          *)&newset,(Value **)&local_b0);
            }
          }
          std::
          _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
          ::swap((_Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  *)(pSVar10 + -1),
                 (_Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  *)&newset);
          uVar11 = 0;
          for (p_Var9 = pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != p_Var1;
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            if (uVar11 == 10) {
              uVar11 = 0xb;
              break;
            }
            uVar11 = uVar11 + 1;
            pVVar2 = *(Value **)(p_Var9 + 1);
            prVar6 = (raw_ostream *)llvm::errs();
            prVar6 = llvm::raw_ostream::operator<<(prVar6,"  SC (next): ");
            prVar6 = llvm::operator<<(prVar6,pVVar2);
            llvm::raw_ostream::operator<<(prVar6,"\n");
          }
          if (uVar11 <= pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            prVar6 = (raw_ostream *)llvm::errs();
            prVar6 = llvm::raw_ostream::operator<<(prVar6," ... and  ");
            prVar6 = (raw_ostream *)
                     llvm::raw_ostream::operator<<
                               (prVar6,(pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count - uVar11) + 1);
            llvm::raw_ostream::operator<<(prVar6," more\n");
          }
          std::
          _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
          ::~_Rb_tree(&newset._M_t);
        }
      }
      if ((!(bool)(~bVar12 &
                  pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
         (0x20 < (ulong)((long)primsec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)primsec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        getCriteriaInstructions
                  (M,pta,primsec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1,&pSVar10[-1].secondary,
                   constructed_only);
        if (pSVar10[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          prVar6 = (raw_ostream *)llvm::errs();
          prVar6 = llvm::raw_ostream::operator<<(prVar6,"SC: Matched \'");
          prVar6 = llvm::raw_ostream::operator<<
                             (prVar6,primsec.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
          llvm::raw_ostream::operator<<(prVar6,"\' (secondary) to: \n");
          uVar11 = 0;
          for (p_Var9 = pSVar10[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != &pSVar10[-1].secondary._M_t._M_impl.super__Rb_tree_header
              ; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            if (uVar11 == 10) {
              uVar11 = 0xb;
              break;
            }
            uVar11 = uVar11 + 1;
            pVVar2 = *(Value **)(p_Var9 + 1);
            prVar6 = (raw_ostream *)llvm::errs();
            prVar6 = llvm::raw_ostream::operator<<(prVar6,"  ");
            prVar6 = llvm::operator<<(prVar6,pVVar2);
            llvm::raw_ostream::operator<<(prVar6,"\n");
          }
          if (uVar11 <= pSVar10[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            prVar6 = (raw_ostream *)llvm::errs();
            prVar6 = llvm::raw_ostream::operator<<(prVar6," ... and  ");
            prVar6 = (raw_ostream *)
                     llvm::raw_ostream::operator<<
                               (prVar6,(pSVar10[-1].primary._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count - uVar11) + 1);
            llvm::raw_ostream::operator<<(prVar6," more\n");
          }
        }
        if (bVar12) {
          std::
          _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<llvm::Value_const*>>
                    ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                      *)&secondaryToAll,
                     pSVar10[-1].secondary._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<const_llvm::Value_*>)
                     &pSVar10[-1].secondary._M_t._M_impl.super__Rb_tree_header);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&primsec);
    }
    opt = opt + 1;
  } while( true );
}

Assistant:

static std::vector<SlicingCriteriaSet> getSlicingCriteriaInstructions(
        llvm::Module &M, const std::string &slicingCriteria,
        bool criteria_are_next_instr, LLVMPointerAnalysis *pta = nullptr,
        bool constructed_only = false) {
    std::vector<std::string> criteria = splitList(slicingCriteria, ';');
    assert(!criteria.empty() && "Did not get slicing criteria");

    std::vector<SlicingCriteriaSet> result;
    std::set<const llvm::Value *> secondaryToAll;

    // map the criteria to instructions
    for (const auto &crit : criteria) {
        if (crit.empty())
            continue;

        result.emplace_back();

        auto primsec = splitList(crit, '|');
        if (primsec.size() > 2) {
            llvm::errs() << "WARNING: Only one | in SC supported, ignoring the "
                            "rest\n";
        }
        assert(primsec.size() >= 1 && "Invalid criterium");
        auto &SC = result.back();
        // do we have some criterion of the form |X?
        // I.e., only secondary SC? It means that that should
        // be added to every primary SC
        bool ssctoall = primsec[0].empty() && primsec.size() > 1;
        if (!primsec[0].empty()) {
            getCriteriaInstructions(M, pta, primsec[0], SC.primary,
                                    constructed_only);
        }

        if (!SC.primary.empty()) {
            llvm::errs() << "SC: Matched '" << primsec[0] << "' to: \n";
            size_t n = 0;
            for (const auto *val : SC.primary) {
                if (++n > 10)
                    break;
                llvm::errs() << "  " << *val << "\n";
            }
            if (SC.primary.size() >= n) {
                llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                             << " more\n";
            }

            if (criteria_are_next_instr) {
                // the given (primary) criteria are just markers for the
                // next instruction, so map the criteria to
                // the next instructions
                auto newset = mapToNextInstr(SC.primary);
                SC.primary.swap(newset);

                n = 0;
                for (const auto *val : SC.primary) {
                    if (++n > 10)
                        break;
                    llvm::errs() << "  SC (next): " << *val << "\n";
                }
                if (SC.primary.size() >= n) {
                    llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                                 << " more\n";
                }
            }
        }

        if ((!SC.primary.empty() || ssctoall) && primsec.size() > 1) {
            getCriteriaInstructions(M, pta, primsec[1], SC.secondary,
                                    constructed_only);

            if (!SC.secondary.empty()) {
                size_t n = 0;
                llvm::errs() << "SC: Matched '" << primsec[1]
                             << "' (secondary) to: \n";
                for (const auto *val : SC.secondary) {
                    if (++n > 10)
                        break;
                    llvm::errs() << "  " << *val << "\n";
                }
                if (SC.secondary.size() >= n) {
                    llvm::errs() << " ... and  " << SC.primary.size() - n + 1
                                 << " more\n";
                }
            }

            if (ssctoall) {
                secondaryToAll.insert(SC.secondary.begin(), SC.secondary.end());
            }
        }
    }

    if (!secondaryToAll.empty()) {
        for (auto &SC : result) {
            if (SC.primary.empty())
                continue;
            SC.secondary.insert(secondaryToAll.begin(), secondaryToAll.end());
        }
    }

    return result;
}